

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

config * Configtable_find(config *key)

{
  uint uVar1;
  int iVar2;
  config *local_30;
  s_x4node *local_28;
  x4node *np;
  int h;
  config *key_local;
  
  if (x4a == (s_x4 *)0x0) {
    key_local = (config *)0x0;
  }
  else {
    uVar1 = confighash(key);
    local_28 = x4a->ht[(int)(uVar1 & x4a->size - 1U)];
    while ((local_28 != (s_x4node *)0x0 &&
           (iVar2 = Configcmp((char *)local_28->data,(char *)key), iVar2 != 0))) {
      local_28 = local_28->next;
    }
    if (local_28 == (s_x4node *)0x0) {
      local_30 = (config *)0x0;
    }
    else {
      local_30 = local_28->data;
    }
    key_local = local_30;
  }
  return key_local;
}

Assistant:

struct config *Configtable_find(struct config *key)
{
  int h;
  x4node *np;

  if( x4a==0 ) return 0;
  h = confighash(key) & (x4a->size-1);
  np = x4a->ht[h];
  while( np ){
    if( Configcmp((const char *) np->data,(const char *) key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}